

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O1

Vector3D * __thiscall CMU462::Face::normal(Vector3D *__return_storage_ptr__,Face *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  p_Var1 = (this->_halfedge)._M_node;
  dVar6 = 0.0;
  dVar7 = 0.0;
  dVar8 = 0.0;
  p_Var4 = p_Var1;
  do {
    p_Var2 = p_Var4[2]._M_next;
    p_Var4 = p_Var4[1]._M_prev;
    p_Var3 = p_Var4[2]._M_next;
    dVar6 = dVar6 + ((double)p_Var2[1]._M_prev * (double)p_Var3[2]._M_next -
                    (double)p_Var3[1]._M_prev * (double)p_Var2[2]._M_next);
    dVar7 = dVar7 + ((double)p_Var2[2]._M_next * (double)p_Var3[1]._M_next -
                    (double)p_Var3[2]._M_next * (double)p_Var2[1]._M_next);
    dVar8 = dVar8 + ((double)p_Var2[1]._M_next * (double)p_Var3[1]._M_prev -
                    (double)p_Var3[1]._M_next * (double)p_Var2[1]._M_prev);
  } while (p_Var4 != p_Var1);
  dVar5 = dVar8 * dVar8 + dVar6 * dVar6 + dVar7 * dVar7;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar5 = 1.0 / dVar5;
  __return_storage_ptr__->x = dVar6 * dVar5;
  __return_storage_ptr__->y = dVar7 * dVar5;
  __return_storage_ptr__->z = dVar8 * dVar5;
  return __return_storage_ptr__;
}

Assistant:

Vector3D Face::normal() const {
  Vector3D N(0., 0., 0.);

  auto h = halfedge();
  do {
    Vector3D pi = h->vertex()->position;
    Vector3D pj = h->next()->vertex()->position;

    N += cross(pi, pj);

    h = h->next();
  } while (h != halfedge());

  return N.unit();
}